

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O1

bool __thiscall
draco::SequentialAttributeDecoder::InitPredictionScheme
          (SequentialAttributeDecoder *this,PredictionSchemeInterface *ps)

{
  PointCloud *pPVar1;
  PointCloudDecoder *this_00;
  char cVar2;
  int iVar3;
  Type TVar4;
  PointAttribute *pPVar5;
  bool bVar6;
  uint uVar7;
  
  iVar3 = (*ps->_vptr_PredictionSchemeInterface[5])(ps);
  bVar6 = iVar3 < 1;
  if (0 < iVar3) {
    pPVar1 = this->decoder_->point_cloud_;
    TVar4 = (*ps->_vptr_PredictionSchemeInterface[6])(ps,0);
    iVar3 = PointCloud::GetNamedAttributeId(pPVar1,TVar4);
    if (iVar3 != -1) {
      uVar7 = 1;
      do {
        this_00 = this->decoder_;
        if (this_00->version_major_ < 2) {
          iVar3 = (*ps->_vptr_PredictionSchemeInterface[7])
                            (ps,(_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 )(this_00->point_cloud_->attributes_).
                                  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar3]._M_t.
                                  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                  ._M_t);
          cVar2 = (char)iVar3;
        }
        else {
          pPVar5 = PointCloudDecoder::GetPortableAttribute(this_00,iVar3);
          if (pPVar5 == (PointAttribute *)0x0) {
            return bVar6;
          }
          iVar3 = (*ps->_vptr_PredictionSchemeInterface[7])(ps,pPVar5);
          cVar2 = (char)iVar3;
        }
        if (cVar2 == '\0') {
          return bVar6;
        }
        iVar3 = (*ps->_vptr_PredictionSchemeInterface[5])(ps);
        bVar6 = iVar3 <= (int)uVar7;
        if (iVar3 <= (int)uVar7) {
          return bVar6;
        }
        pPVar1 = this->decoder_->point_cloud_;
        TVar4 = (*ps->_vptr_PredictionSchemeInterface[6])(ps,(ulong)uVar7);
        iVar3 = PointCloud::GetNamedAttributeId(pPVar1,TVar4);
        uVar7 = uVar7 + 1;
      } while (iVar3 != -1);
    }
  }
  return bVar6;
}

Assistant:

bool SequentialAttributeDecoder::InitPredictionScheme(
    PredictionSchemeInterface *ps) {
  for (int i = 0; i < ps->GetNumParentAttributes(); ++i) {
    const int att_id = decoder_->point_cloud()->GetNamedAttributeId(
        ps->GetParentAttributeType(i));
    if (att_id == -1) {
      return false;  // Requested attribute does not exist.
    }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!ps->SetParentAttribute(decoder_->point_cloud()->attribute(att_id))) {
        return false;
      }
    } else
#endif
    {
      const PointAttribute *const pa = decoder_->GetPortableAttribute(att_id);
      if (pa == nullptr || !ps->SetParentAttribute(pa)) {
        return false;
      }
    }
  }
  return true;
}